

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManIsoStrashReduce(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  int nPos;
  Vec_Wec_t *vSupps_00;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  int *pPos;
  Gia_Man_t *pGVar1;
  Vec_Ptr_t *pVVar2;
  Gia_Man_t *pNew;
  Vec_Int_t *vFirsts;
  Vec_Wec_t *vPosEquivs;
  Vec_Wec_t *vSupps;
  int fVerbose_local;
  Vec_Ptr_t **pvPosEquivs_local;
  Gia_Man_t *p_local;
  
  vSupps_00 = Gia_ManCreateCoSupps(p,fVerbose);
  p_00 = Gia_ManIsoStrashReduceInt(p,vSupps_00,fVerbose);
  p_01 = Vec_WecCollectFirsts(p_00);
  pPos = Vec_IntArray(p_01);
  nPos = Vec_IntSize(p_01);
  pGVar1 = Gia_ManDupCones(p,pPos,nPos,0);
  Vec_IntFree(p_01);
  Vec_WecFree(vSupps_00);
  if (fVerbose != 0) {
    printf("Nontrivial classes:\n");
    Vec_WecPrint(p_00,1);
  }
  if (pvPosEquivs != (Vec_Ptr_t **)0x0) {
    pVVar2 = Vec_WecConvertToVecPtr(p_00);
    *pvPosEquivs = pVVar2;
  }
  Vec_WecFree(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManIsoStrashReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    Vec_Wec_t * vSupps = Gia_ManCreateCoSupps( p, fVerbose );
    Vec_Wec_t * vPosEquivs = Gia_ManIsoStrashReduceInt( p, vSupps, fVerbose );
    // find the first outputs and derive GIA
    Vec_Int_t * vFirsts = Vec_WecCollectFirsts( vPosEquivs );
    Gia_Man_t * pNew = Gia_ManDupCones( p, Vec_IntArray(vFirsts), Vec_IntSize(vFirsts), 0 );
    Vec_IntFree( vFirsts );
    Vec_WecFree( vSupps );
    // report and return    
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vPosEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vPosEquivs );
    Vec_WecFree( vPosEquivs );
    return pNew;
}